

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolutionLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  ulong outChannels;
  bool bVar3;
  WeightParamType WVar4;
  WeightParamType WVar5;
  ConvolutionLayerParams *pCVar6;
  uint64 uVar7;
  ulong uVar8;
  unsigned_long __val;
  string *psVar9;
  WeightParams *pWVar10;
  ulong uVar11;
  unsigned_long uVar12;
  string err;
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Result r;
  unsigned_long local_230;
  unsigned_long local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  unsigned_long local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,2);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar3 = Result::good(&r);
  if (bVar3) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    bVar3 = Result::good(&r);
    if (bVar3) {
      if (this->ndArrayInterpretation != true) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
          std::operator+(&err_1,"Convolution Layer \'",(layer->name_).ptr_);
          std::operator+(&err,&err_1,
                         "\' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true."
                        );
          std::__cxx11::string::~string((string *)&err_1);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_00243411;
        }
LAB_00243348:
        pCVar6 = Specification::NeuralNetworkLayer::convolution(layer);
        if (pCVar6->_oneof_case_[0] == 0) {
          std::operator+(&err,"Padding type for convolution layer \'",(layer->name_).ptr_);
          std::operator+(&err_1,&err,"\' is not set.");
          std::__cxx11::string::~string((string *)&err);
          Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
          goto LAB_0024345f;
        }
        pCVar6 = Specification::NeuralNetworkLayer::convolution(layer);
        bVar3 = pCVar6->isdeconvolution_;
        iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
        if ((iVar2 != 1 & bVar3) == 1) {
          std::operator+(&err_1,"Deconvolution Layer \'",(layer->name_).ptr_);
          std::operator+(&err,&err_1,"\' does not support weight as input tensor.");
          std::__cxx11::string::~string((string *)&err_1);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_00243411:
          psVar9 = &err;
        }
        else {
          if (((iVar2 != 1) && (0 < (pCVar6->dilationfactor_).current_size_)) &&
             ((uVar7 = Specification::ConvolutionLayerParams::dilationfactor(pCVar6,0), 1 < uVar7 ||
              ((1 < (pCVar6->dilationfactor_).current_size_ &&
               (uVar7 = Specification::ConvolutionLayerParams::dilationfactor(pCVar6,1), 1 < uVar7))
              )))) {
            std::operator+(&err_1,"Convolution layer: \'",(layer->name_).ptr_);
            std::operator+(&err,&err_1,
                           "\' , dilated convolution does not support weight as input tensor.");
            std::__cxx11::string::~string((string *)&err_1);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
            goto LAB_00243411;
          }
          outChannels = pCVar6->outputchannels_;
          uVar11 = pCVar6->ngroups_ + (ulong)(pCVar6->ngroups_ == 0);
          uVar12 = pCVar6->kernelchannels_;
          local_228 = 3;
          if ((pCVar6->kernelsize_).current_size_ < 1) {
            local_230 = 3;
          }
          else {
            local_230 = Specification::ConvolutionLayerParams::kernelsize(pCVar6,0);
            if (1 < (pCVar6->kernelsize_).current_size_) {
              local_228 = Specification::ConvolutionLayerParams::kernelsize(pCVar6,1);
            }
          }
          iVar2 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
          if (1 < iVar2) goto LAB_0024359c;
          bVar1 = pCVar6->hasbias_;
          if (iVar2 != 1 && bVar1 == true) {
            std::operator+(&err,"Convolution layer: \'",(layer->name_).ptr_);
            std::operator+(&err_1,&err,"\' with dynamic weight does not support static bias.");
            std::__cxx11::string::~string((string *)&err);
            Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&err_1);
          }
          pWVar10 = pCVar6->weights_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar4 = valueType(pWVar10);
          pWVar10 = pCVar6->bias_;
          if (pWVar10 == (WeightParams *)0x0) {
            pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          WVar5 = valueType(pWVar10);
          if ((WVar4 != UNSPECIFIED) && ((WVar5 == UNSPECIFIED & bVar1) == 0)) {
            if ((bVar1 == false) ||
               (((WVar4 != FLOAT16 || (WVar5 != FLOAT32)) &&
                ((WVar4 != FLOAT32 || (WVar5 != FLOAT16)))))) {
              uVar8 = outChannels;
              if (bVar3 != false) {
                uVar8 = outChannels / uVar11;
              }
              local_1d8 = local_228 * local_230 * uVar8 * uVar12;
              if (WVar4 < QUINT) {
                pWVar10 = pCVar6->weights_;
                if (pWVar10 == (WeightParams *)0x0) {
                  pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                if (WVar4 == FLOAT32) {
                  __val = (unsigned_long)(pWVar10->floatvalue_).current_size_;
                }
                else {
                  __val = ((pWVar10->float16value_).ptr_)->_M_string_length >> 1;
                }
                if (__val != local_1d8) {
                  if (bVar3 == false) {
                    std::operator+(&local_d0,"Convolution layer \'",(layer->name_).ptr_);
                    std::operator+(&local_b0,&local_d0,"\' has weight matrix of size ");
                    std::__cxx11::to_string(&local_f0,__val);
                    std::operator+(&local_90,&local_b0,&local_f0);
                    std::operator+(&local_70,&local_90," to encode a ");
                    std::__cxx11::to_string(&local_110,outChannels);
                    std::operator+(&local_1d0,&local_70,&local_110);
                    std::operator+(&local_1b0,&local_1d0,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_130,uVar12);
                    std::operator+(&local_190,&local_1b0,&local_130);
                    std::operator+(&local_218,&local_190,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_150,local_230);
                    std::operator+(&local_1f8,&local_218,&local_150);
                    std::operator+(&local_278,&local_1f8,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_170,local_228);
                    std::operator+(&err,&local_278,&local_170);
                    std::operator+(&err_1,&err," convolution.");
                    std::__cxx11::string::~string((string *)&err);
                    std::__cxx11::string::~string((string *)&local_170);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string((string *)&local_1f8);
                    std::__cxx11::string::~string((string *)&local_150);
                    std::__cxx11::string::~string((string *)&local_218);
                    std::__cxx11::string::~string((string *)&local_190);
                    std::__cxx11::string::~string((string *)&local_130);
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1d0);
                    std::__cxx11::string::~string((string *)&local_110);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_90);
                    std::__cxx11::string::~string((string *)&local_f0);
                    std::__cxx11::string::~string((string *)&local_b0);
                    std::__cxx11::string::~string((string *)&local_d0);
                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
                  }
                  else {
                    std::operator+(&local_d0,"Deconvolution layer \'",(layer->name_).ptr_);
                    std::operator+(&local_b0,&local_d0,"\' has weight matrix of size ");
                    std::__cxx11::to_string(&local_f0,__val);
                    std::operator+(&local_90,&local_b0,&local_f0);
                    std::operator+(&local_70,&local_90," to encode a ");
                    std::__cxx11::to_string(&local_110,uVar12);
                    std::operator+(&local_1d0,&local_70,&local_110);
                    std::operator+(&local_1b0,&local_1d0,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_130,outChannels / uVar11);
                    std::operator+(&local_190,&local_1b0,&local_130);
                    std::operator+(&local_218,&local_190,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_150,local_230);
                    std::operator+(&local_1f8,&local_218,&local_150);
                    std::operator+(&local_278,&local_1f8,anon_var_dwarf_3062b3);
                    std::__cxx11::to_string(&local_170,local_228);
                    std::operator+(&err,&local_278,&local_170);
                    std::operator+(&err_1,&err," convolution.");
                    std::__cxx11::string::~string((string *)&err);
                    std::__cxx11::string::~string((string *)&local_170);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string((string *)&local_1f8);
                    std::__cxx11::string::~string((string *)&local_150);
                    std::__cxx11::string::~string((string *)&local_218);
                    std::__cxx11::string::~string((string *)&local_190);
                    std::__cxx11::string::~string((string *)&local_130);
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1d0);
                    std::__cxx11::string::~string((string *)&local_110);
                    std::__cxx11::string::~string((string *)&local_70);
                    std::__cxx11::string::~string((string *)&local_90);
                    std::__cxx11::string::~string((string *)&local_f0);
                    std::__cxx11::string::~string((string *)&local_b0);
                    std::__cxx11::string::~string((string *)&local_d0);
                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
                  }
                  goto LAB_0024345f;
                }
              }
              else {
                if (WVar4 != QUINT) {
                  std::operator+(&local_278,"Layer ",(layer->name_).ptr_);
                  std::operator+(&err_1,&local_278,"has not specified weights.");
                  Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
                  goto LAB_002438a9;
                }
                pWVar10 = pCVar6->weights_;
                if (pWVar10 == (WeightParams *)0x0) {
                  pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                std::__cxx11::string::string((string *)&err_1,"Convolution",(allocator *)&local_1f8)
                ;
                psVar9 = (layer->name_).ptr_;
                std::__cxx11::string::string((string *)&local_278,"weight",(allocator *)&local_218);
                validateGeneralWeightParams
                          ((Result *)&err,pWVar10,local_1d8,outChannels,&err_1,psVar9,&local_278);
                Result::operator=(&r,(Result *)&err);
                std::__cxx11::string::~string((string *)&err._M_string_length);
                std::__cxx11::string::~string((string *)&local_278);
                std::__cxx11::string::~string((string *)&err_1);
                bVar3 = Result::good(&r);
                if (!bVar3) goto LAB_0024359c;
              }
              if (bVar1 != false) {
                if (WVar5 < QUINT) {
                  pWVar10 = pCVar6->bias_;
                  if (pWVar10 == (WeightParams *)0x0) {
                    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  if (WVar5 == FLOAT32) {
                    uVar12 = (unsigned_long)(pWVar10->floatvalue_).current_size_;
                  }
                  else {
                    uVar12 = ((pWVar10->float16value_).ptr_)->_M_string_length >> 1;
                  }
                  if (uVar12 != outChannels) {
                    std::operator+(&local_190,"Convolution layer \'",(layer->name_).ptr_);
                    std::operator+(&local_218,&local_190,"\' has a bias vector of size ");
                    std::__cxx11::to_string(&local_1b0,uVar12);
                    std::operator+(&local_1f8,&local_218,&local_1b0);
                    std::operator+(&local_278,&local_1f8," but should be ");
                    std::__cxx11::to_string(&local_1d0,outChannels);
                    std::operator+(&err,&local_278,&local_1d0);
                    std::operator+(&err_1,&err,".");
                    std::__cxx11::string::~string((string *)&err);
                    std::__cxx11::string::~string((string *)&local_1d0);
                    std::__cxx11::string::~string((string *)&local_278);
                    std::__cxx11::string::~string((string *)&local_1f8);
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_218);
                    std::__cxx11::string::~string((string *)&local_190);
                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
                    goto LAB_0024345f;
                  }
                }
                else {
                  if (WVar5 != QUINT) {
                    std::operator+(&local_278,"Layer ",(layer->name_).ptr_);
                    std::operator+(&err_1,&local_278,"has not specified bias.");
                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
                    goto LAB_002438a9;
                  }
                  pWVar10 = pCVar6->bias_;
                  if (pWVar10 == (WeightParams *)0x0) {
                    pWVar10 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string
                            ((string *)&err_1,"Convolution",(allocator *)&local_1f8);
                  psVar9 = (layer->name_).ptr_;
                  std::__cxx11::string::string((string *)&local_278,"bias",(allocator *)&local_218);
                  validateGeneralWeightParams
                            ((Result *)&err,pWVar10,outChannels,1,&err_1,psVar9,&local_278);
                  Result::operator=(&r,(Result *)&err);
                  std::__cxx11::string::~string((string *)&err._M_string_length);
                  std::__cxx11::string::~string((string *)&local_278);
                  std::__cxx11::string::~string((string *)&err_1);
                  Result::good(&r);
                }
              }
            }
            else {
              std::operator+(&local_278,"Convolution layer ",(layer->name_).ptr_);
              std::operator+(&err_1,&local_278,
                             "has unmatched precisions of weights/bias They should either be half or full precision."
                            );
              Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
LAB_002438a9:
              Result::operator=(&r,(Result *)&err);
              std::__cxx11::string::~string((string *)&err._M_string_length);
              std::__cxx11::string::~string((string *)&err_1);
              std::__cxx11::string::~string((string *)&local_278);
            }
            goto LAB_0024359c;
          }
          std::operator+(&err,"Convolution layer \'",(layer->name_).ptr_);
          std::operator+(&err_1,&err,"\'  has invalid weights/bias fields.");
          std::__cxx11::string::~string((string *)&err);
          Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
LAB_0024345f:
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          Result::Result(__return_storage_ptr__,&r);
          psVar9 = &err_1;
        }
        std::__cxx11::string::~string((string *)psVar9);
        goto LAB_002435a1;
      }
      std::__cxx11::string::string((string *)&local_50,"Convolution",(allocator *)&err_1);
      validateInputOutputRankEquality((Result *)&err,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&err);
      std::__cxx11::string::~string((string *)&err._M_string_length);
      std::__cxx11::string::~string((string *)&local_50);
      bVar3 = Result::good(&r);
      if (bVar3) {
        std::__cxx11::string::string((string *)&err_1,"Convolution",(allocator *)&local_278);
        validateRankCount((Result *)&err,layer,&err_1,4,-1,&this->blobNameToRank);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&err_1);
        bVar3 = Result::good(&r);
        if (bVar3) goto LAB_00243348;
      }
    }
  }
LAB_0024359c:
  Result::Result(__return_storage_ptr__,&r);
LAB_002435a1:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolutionLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Convolution", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    } else {
        if (layer.input_size() != 1) {
            std::string err = "Convolution Layer '" + layer.name() +
            "' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // We need to check if the ConvolutionPaddingType is set
    if (layer.convolution().ConvolutionPaddingType_case() == Specification::ConvolutionLayerParams::ConvolutionPaddingTypeCase::CONVOLUTIONPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for convolution layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    const auto& params = layer.convolution();
    bool is_deconv = params.isdeconvolution();
    if (is_deconv && layer.input_size() != 1) {
        std::string err = "Deconvolution Layer '" + layer.name() + "' does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() != 1 && (
        ((params.dilationfactor_size() > 0 && params.dilationfactor(0) > 1) ||
        (params.dilationfactor_size() > 1 && params.dilationfactor(1) > 1))
        )) {
        std::string err = "Convolution layer: '" + layer.name() + "' , dilated convolution does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    uint64_t kernelChannels = params.kernelchannels();
    uint64_t outputChannels = params.outputchannels();
    uint64_t nGroups = params.ngroups();
    if (nGroups == 0) {
        // default value specified in protobuf
        nGroups = 1;
    }
    uint64_t kernelHeight;
    if (params.kernelsize_size() > 0) {
        kernelHeight = params.kernelsize(0);
    }
    else {
        // this is the default specified in the protobuf file
        kernelHeight = 3;
    }
    uint64_t kernelWidth;
    if (params.kernelsize_size() > 1) {
        kernelWidth = params.kernelsize(1);
    }
    else {
        kernelWidth = 3;
    }

    if (layer.input_size() > 1) {
        return r;
    }

    bool has_bias = params.hasbias();
    if (has_bias && layer.input_size() != 1) {
        std::string err = "Convolution layer: '" + layer.name() + "' with dynamic weight does not support static bias.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ( (weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution layer '" + layer.name() + "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution layer " + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Get populated weight and bias sizes
    // Check weights
    uint64_t expected_weight_size = 0;
    // conv: outputChannels, kernelChannels, kernelHeight, kernelWidth
    // deconv: kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth
    if (is_deconv) {
        expected_weight_size = kernelChannels * (outputChannels / nGroups) * kernelHeight * kernelWidth;
    }
    else {
        expected_weight_size = outputChannels * kernelChannels * kernelHeight * kernelWidth;
    }
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16) {
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(params.weights().floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(params.weights().float16value().size() / 2);
        }
        if (weight_size != expected_weight_size) {
            if (is_deconv) {
                std::string err = "Deconvolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(kernelChannels) + " × " + std::to_string(outputChannels/nGroups) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
            else {
                std::string err = "Convolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(outputChannels) + " × " + std::to_string(kernelChannels) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        }
    } // if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16)
    else if (weightsValueType == QUINT) {
        r = validateGeneralWeightParams(params.weights(), expected_weight_size, outputChannels, "Convolution", layer.name(), "weight");
        if (!r.good()) return r;
    } else { // EMPTY
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified weights.");
        return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(params.bias().floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution layer '" + layer.name() + "' has a bias vector of size " +
                std::to_string(bias_size) + " but should be " + std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // quantization of bias vector should be 1
            r = validateGeneralWeightParams(params.bias(), outputChannels, 1, "Convolution", layer.name(), "bias");
            if (!r.good()) return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified bias.");
            return r;
        }
    }
    return r;
}